

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int get_path_component(char *name,int n,char *fn)

{
  char *pcVar1;
  size_t sVar2;
  int local_34;
  int l;
  char *p;
  char *fn_local;
  int n_local;
  char *name_local;
  
  pcVar1 = strchr(fn,0x2f);
  if (pcVar1 == (char *)0x0) {
    sVar2 = strlen(fn);
    local_34 = (int)sVar2;
    if (local_34 == 0) {
      return 0;
    }
  }
  else {
    local_34 = (int)pcVar1 - (int)fn;
  }
  if (n + -1 < local_34) {
    name_local._4_4_ = -1;
  }
  else {
    memcpy(name,fn,(long)local_34);
    name[local_34] = '\0';
    name_local._4_4_ = local_34;
  }
  return name_local._4_4_;
}

Assistant:

static int
get_path_component(char *name, size_t n, const char *fn)
{
	char *p;
	size_t l;

	p = strchr(fn, '/');
	if (p == NULL) {
		if ((l = strlen(fn)) == 0)
			return (0);
	} else
		l = p - fn;
	if (l > n -1)
		return (-1);
	memcpy(name, fn, l);
	name[l] = '\0';

	return ((int)l);
}